

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O2

void __thiscall pm::Camera::computeUvw(Camera *this)

{
  Vector3 *this_00;
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 local_30;
  float local_28;
  
  fVar1 = (this->eye_).z;
  fVar2 = (this->lookAt_).z;
  this_00 = &this->w_;
  uVar3 = (this->eye_).x;
  uVar5 = (this->eye_).y;
  uVar4 = (this->lookAt_).x;
  uVar6 = (this->lookAt_).y;
  (this->w_).x = (float)uVar3 - (float)uVar4;
  (this->w_).y = (float)uVar5 - (float)uVar6;
  (this->w_).z = fVar1 - fVar2;
  Vector3::normalize(this_00);
  cross(&this->up_,this_00);
  (this->u_).x = (float)(undefined4)local_30;
  (this->u_).y = (float)local_30._4_4_;
  (this->u_).z = local_28;
  Vector3::normalize(&this->u_);
  cross(this_00,&this->u_);
  (this->v_).x = (float)(undefined4)local_30;
  (this->v_).y = (float)local_30._4_4_;
  (this->v_).z = local_28;
  return;
}

Assistant:

void Camera::computeUvw()
{
	w_ = eye_ - lookAt_;
	w_.normalize();
	u_ = cross(up_, w_);
	u_.normalize();
	v_ = cross(w_, u_);

#if 0
	// take care of the singularity by hardwiring in specific camera orientations
	if (eye_.x == lookAt_.x && eye_.z == lookAt_.z && eye_.y > lookAt_.y)
	{
		// camera looking vertically down
		u_ = Vector3(0.0f, 0.0f, 1.0f);
		v_ = Vector3(1.0f, 0.0f, 0.0f);
		w_ = Vector3(0.0f, 1.0f, 0.0f);
	}

	if (eye_.x == lookAt_.x && eye_.z == lookAt_.z && eye_.y < lookAt_.y)
	{
		// camera looking vertically up
		u_ = Vector3(1.0f, 0.0f, 0.0f);
		v_ = Vector3(0.0f, 0.0f, 1.0f);
		w_ = Vector3(0.0f, -1.0f, 0.0f);
	}
#endif
}